

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

bool __thiscall
Diligent::anon_unknown_77::BindResourceHelper::UpdateCachedResource<Diligent::BufferViewVkImpl>
          (BindResourceHelper *this,RefCntAutoPtr<Diligent::BufferViewVkImpl> *pObject,
          SET_SHADER_RESOURCE_FLAGS Flags,Uint64 BufferBaseOffset,Uint64 BufferRangeSize)

{
  Uint32 CacheOffset;
  Uint32 _ArrayIndex;
  Resource *pRVar1;
  ShaderResourceCacheVk *this_00;
  undefined8 uVar2;
  bool bVar3;
  SET_SHADER_RESOURCE_FLAGS SVar4;
  IDeviceObject *pIVar5;
  Char *Message;
  RenderDeviceVkImpl *this_01;
  VulkanLogicalDevice *pLogicalDevice;
  RefCntAutoPtr<Diligent::IDeviceObject> local_98;
  SetResourceInfo local_90;
  undefined1 local_60 [8];
  string msg;
  Uint64 BufferRangeSize_local;
  Uint64 BufferBaseOffset_local;
  SET_SHADER_RESOURCE_FLAGS Flags_local;
  RefCntAutoPtr<Diligent::BufferViewVkImpl> *pObject_local;
  BindResourceHelper *this_local;
  
  bVar3 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)pObject);
  if (bVar3) {
    pIVar5 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_
                       ((RefCntAutoPtr *)&this->m_DstRes->pObject);
    if (((pIVar5 == (IDeviceObject *)0x0) ||
        (this->m_ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) ||
       (SVar4 = Diligent::operator&(Flags,SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE),
       SVar4 != SET_SHADER_RESOURCE_FLAG_NONE)) {
      this_00 = this->m_ResourceCache;
      this_01 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                             *)this->m_Signature);
      pLogicalDevice = RenderDeviceVkImpl::GetLogicalDevice(this_01);
      uVar2 = *(undefined8 *)this->m_Attribs;
      CacheOffset = this->m_DstResCacheOffset;
      _ArrayIndex = this->m_ArrayIndex;
      RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr<Diligent::BufferViewVkImpl,void>
                (&local_98,pObject);
      ShaderResourceCacheVk::SetResourceInfo::SetResourceInfo
                (&local_90,(uint)uVar2 & 0xffff,_ArrayIndex,&local_98,BufferBaseOffset,
                 BufferRangeSize);
      ShaderResourceCacheVk::SetResource
                (this_00,pLogicalDevice,(uint)((ulong)uVar2 >> 0x3e) & 1,CacheOffset,&local_90);
      ShaderResourceCacheVk::SetResourceInfo::~SetResourceInfo(&local_90);
      RefCntAutoPtr<Diligent::IDeviceObject>::~RefCntAutoPtr(&local_98);
      this_local._7_1_ = true;
    }
    else {
      pRVar1 = this->m_DstRes;
      RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr<Diligent::BufferViewVkImpl,void>
                ((RefCntAutoPtr<Diligent::IDeviceObject> *)((long)&msg.field_2 + 8),pObject);
      bVar3 = RefCntAutoPtr<Diligent::IDeviceObject>::operator==
                        (&pRVar1->pObject,
                         (RefCntAutoPtr<Diligent::IDeviceObject> *)((long)&msg.field_2 + 8));
      RefCntAutoPtr<Diligent::IDeviceObject>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IDeviceObject> *)((long)&msg.field_2 + 8));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        FormatString<char[64]>
                  ((string *)local_60,
                   (char (*) [64])"Binding another object to a non-dynamic variable is not allowed")
        ;
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"UpdateCachedResource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                   ,0x192);
        std::__cxx11::string::~string((string *)local_60);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BindResourceHelper::UpdateCachedResource(RefCntAutoPtr<ObjectType>&& pObject,
                                              SET_SHADER_RESOURCE_FLAGS   Flags,
                                              Uint64                      BufferBaseOffset,
                                              Uint64                      BufferRangeSize) const
{
    if (pObject)
    {
        if (m_DstRes.pObject != nullptr &&
            m_ResDesc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC &&
            (Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) == 0)
        {
            DEV_CHECK_ERR(m_DstRes.pObject == pObject, "Binding another object to a non-dynamic variable is not allowed");
            // Do not update resource if one is already bound unless it is dynamic. This may be
            // dangerous as writing descriptors while they are used by the GPU is an undefined behavior
            return false;
        }

        m_ResourceCache.SetResource(&m_Signature.GetDevice()->GetLogicalDevice(),
                                    m_Attribs.DescrSet,
                                    m_DstResCacheOffset,
                                    {
                                        m_Attribs.BindingIndex,
                                        m_ArrayIndex,
                                        std::move(pObject),
                                        BufferBaseOffset,
                                        BufferRangeSize //
                                    });
        return true;
    }
    else
    {
        return false;
    }
}